

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall
TrodesMsg::addcontents<std::__cxx11::string>
          (TrodesMsg *this,string *f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head)

{
  ulong uVar1;
  string *psVar2;
  TrodesMsg *in_RSI;
  TrodesMsg *in_RDI;
  string e;
  string *in_stack_ffffffffffffff60;
  string *this_00;
  undefined8 in_stack_ffffffffffffff68;
  allocator *paVar3;
  char c;
  TrodesMsg *this_01;
  string local_50;
  undefined1 local_2d;
  allocator local_19 [25];
  
  c = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  this_01 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator[]((ulong)in_RSI);
    appendArg(this_01,c,in_stack_ffffffffffffff60);
    std::__cxx11::string::operator[]((ulong)in_RSI);
    std::__cxx11::string::push_back((char)in_RDI);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)in_RSI);
    addcontents(in_RDI,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  local_2d = 1;
  psVar2 = (string *)__cxa_allocate_exception(0x20);
  paVar3 = local_19;
  this_00 = psVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,"TrodesMsg Error: Mismatched format string and variables",paVar3);
  local_2d = 0;
  __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void addcontents(std::string f, H head, T... tail){
        try{
            if(f.empty())
                throw std::string("TrodesMsg Error: Mismatched format string and variables");
            appendArg(f[0], head);
            format.push_back(f[0]);
            addcontents(f.substr(1), tail...);
        } catch(std::string e){
            std::cerr << "[TrodesMsg::addcontents Error] " << e << "\n";
        } catch(...){
            std::cout << "[TrodesMsg::addcontents Error] Unknown exception thrown!\n";
        }
    }